

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::RgbaOutputFile::RgbaOutputFile
          (RgbaOutputFile *this,char *name,int width,int height,RgbaChannels rgbaChannels,
          float pixelAspectRatio,V2f *screenWindowCenter,float screenWindowWidth,LineOrder lineOrder
          ,Compression compression,int numThreads)

{
  OutputFile *this_00;
  ToYca *this_01;
  Header HStack_58;
  
  this->_vptr_RgbaOutputFile = (_func_int **)&PTR__RgbaOutputFile_001e3fa0;
  this->_outputFile = (OutputFile *)0x0;
  this->_toYca = (ToYca *)0x0;
  Header::Header(&HStack_58,width,height,pixelAspectRatio,screenWindowCenter,screenWindowWidth,
                 lineOrder,compression);
  anon_unknown_1::insertChannels(&HStack_58,rgbaChannels);
  this_00 = (OutputFile *)operator_new(0x10);
  OutputFile::OutputFile(this_00,name,&HStack_58,numThreads);
  this->_outputFile = this_00;
  if ((rgbaChannels & WRITE_YC) != 0) {
    this_01 = (ToYca *)operator_new(0x160);
    ToYca::ToYca(this_01,this_00,rgbaChannels);
    this->_toYca = this_01;
  }
  Header::~Header(&HStack_58);
  return;
}

Assistant:

RgbaOutputFile::RgbaOutputFile (
    const char                 name[],
    int                        width,
    int                        height,
    RgbaChannels               rgbaChannels,
    float                      pixelAspectRatio,
    const IMATH_NAMESPACE::V2f screenWindowCenter,
    float                      screenWindowWidth,
    LineOrder                  lineOrder,
    Compression                compression,
    int                        numThreads)
    : _outputFile (0), _toYca (0)
{
    Header hd (
        width,
        height,
        pixelAspectRatio,
        screenWindowCenter,
        screenWindowWidth,
        lineOrder,
        compression);

    insertChannels (hd, rgbaChannels);
    _outputFile = new OutputFile (name, hd, numThreads);

    if (rgbaChannels & (WRITE_Y | WRITE_C))
        _toYca = new ToYca (*_outputFile, rgbaChannels);
}